

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O3

QMatrix * Mul_SQ(double S,QMatrix *Q)

{
  double dVar1;
  ElType **ppEVar2;
  Boolean *pBVar3;
  QMatrixType *pQVar4;
  LASErrIdType LVar5;
  QMatrix *Q_00;
  char *pcVar6;
  size_t sVar7;
  char *Object1Name;
  undefined4 local_38;
  
  Q_Lock(Q);
  LVar5 = LASResult();
  if (LVar5 == LASOK) {
    Q_00 = (QMatrix *)malloc(0xb0);
    pcVar6 = Q_GetName(Q);
    sVar7 = strlen(pcVar6);
    pcVar6 = (char *)malloc(sVar7 + 0x14);
    Object1Name = Q_GetName(Q);
    if (pcVar6 == (char *)0x0 || Q_00 == (QMatrix *)0x0) {
      LASError(LASMemAllocErr,"Mul_SQ",Object1Name,(char *)0x0,(char *)0x0);
      if (Q_00 != (QMatrix *)0x0) {
        free(Q_00);
      }
      if (pcVar6 == (char *)0x0) goto LAB_0010bb64;
    }
    else {
      local_38 = SUB84(S,0);
      sprintf(pcVar6,"%12.5e * (%s)",local_38,Object1Name);
      Q_Constr(Q_00,pcVar6,Q->Dim,Q->Symmetry,Q->ElOrder,Tempor,False);
      LVar5 = LASResult();
      if (LVar5 == LASOK) {
        if ((Q->Instance == Tempor) && (Q->OwnData != False)) {
          Q->OwnData = False;
          Q_00->OwnData = True;
        }
        dVar1 = Q->MultiplU;
        Q_00->MultiplD = S * Q->MultiplD;
        Q_00->MultiplU = S * dVar1;
        Q_00->MultiplL = S * Q->MultiplL;
        ppEVar2 = Q->El;
        Q_00->Len = Q->Len;
        Q_00->El = ppEVar2;
        pBVar3 = Q->DiagElAlloc;
        Q_00->ElSorted = Q->ElSorted;
        Q_00->DiagElAlloc = pBVar3;
        pBVar3 = Q->ZeroInDiag;
        Q_00->DiagEl = Q->DiagEl;
        Q_00->ZeroInDiag = pBVar3;
        Q_00->InvDiagEl = Q->InvDiagEl;
        Q_00->UnitRightKer = Q->UnitRightKer;
        Q_00->RightKerCmp = Q->RightKerCmp;
        Q_00->UnitLeftKer = Q->UnitLeftKer;
        Q_00->LeftKerCmp = Q->LeftKerCmp;
        pQVar4 = Q->ILU;
        Q_00->ILUExists = Q->ILUExists;
        Q_00->ILU = pQVar4;
      }
    }
    free(pcVar6);
  }
  else {
    Q_00 = (QMatrix *)0x0;
  }
LAB_0010bb64:
  Q_Unlock(Q);
  return Q_00;
}

Assistant:

QMatrix *Mul_SQ(double S, QMatrix *Q)
/* QRes = S * Q */
{
    QMatrix *QRes;
    
    char *QResName;

    Q_Lock(Q);
    
    if (LASResult() == LASOK) {
        QRes = (QMatrix *)malloc(sizeof(QMatrix));
        QResName = (char *)malloc((strlen(Q_GetName(Q)) + 20) * sizeof(char));
        if (QRes != NULL && QResName != NULL) {
            sprintf(QResName, "%12.5e * (%s)", S, Q_GetName(Q));
            Q_Constr(QRes, QResName, Q->Dim, Q->Symmetry, Q->ElOrder, Tempor, False);
            if (LASResult() == LASOK) {
                if (Q->Instance == Tempor && Q->OwnData) {
                    Q->OwnData = False;
                    QRes->OwnData = True;
                }
                QRes->MultiplD = S * Q->MultiplD;
                QRes->MultiplU = S * Q->MultiplU;
                QRes->MultiplL = S * Q->MultiplL;
                QRes->Len = Q->Len;
                QRes->El = Q->El;
                QRes->ElSorted = Q->ElSorted;
                QRes->DiagElAlloc = Q->DiagElAlloc;
                QRes->DiagEl = Q->DiagEl;
                QRes->ZeroInDiag = Q->ZeroInDiag;
                QRes->InvDiagEl = Q->InvDiagEl;
                QRes->UnitRightKer = Q->UnitRightKer;
                QRes->RightKerCmp = Q->RightKerCmp;
                QRes->UnitLeftKer = Q->UnitLeftKer;
                QRes->LeftKerCmp = Q->LeftKerCmp;
                QRes->ILUExists = Q->ILUExists;
                QRes->ILU = Q->ILU;
            }
        } else {
            LASError(LASMemAllocErr, "Mul_SQ", Q_GetName(Q), NULL, NULL);
            if (QRes != NULL)
                free(QRes);
        }
            
        if (QResName != NULL)
            free(QResName);
    } else {
        QRes = NULL;
    }

    Q_Unlock(Q);

    return(QRes);
}